

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::UpdateDebugToolItemPicker(void)

{
  bool bVar1;
  ImVec4 *col;
  ImGuiMouseButton unaff_retaddr;
  ImGuiID hovered_id;
  ImGuiContext *g;
  undefined1 in_stack_fffffffffffffff3;
  ImGuiID key;
  ImGuiContext *pIVar2;
  
  pIVar2 = GImGui;
  GImGui->DebugItemPickerBreakId = 0;
  if ((pIVar2->DebugItemPickerActive & 1U) != 0) {
    key = pIVar2->HoveredIdPreviousFrame;
    SetMouseCursor(7);
    bVar1 = IsKeyPressedMap(key,(bool)in_stack_fffffffffffffff3);
    if (bVar1) {
      pIVar2->DebugItemPickerActive = false;
    }
    bVar1 = IsMouseClicked(unaff_retaddr,SUB81((ulong)pIVar2 >> 0x38,0));
    if ((bVar1) && (key != 0)) {
      pIVar2->DebugItemPickerBreakId = key;
      pIVar2->DebugItemPickerActive = false;
    }
    SetNextWindowBgAlpha(0.6);
    BeginTooltip();
    Text("HoveredId: 0x%08X",(ulong)key);
    Text("Press ESC to abort picking.");
    col = GetStyleColorVec4((uint)(key == 0));
    TextColored(col,"Click to break in debugger!");
    EndTooltip();
  }
  return;
}

Assistant:

void ImGui::UpdateDebugToolItemPicker()
{
    ImGuiContext& g = *GImGui;
    g.DebugItemPickerBreakId = 0;
    if (g.DebugItemPickerActive)
    {
        const ImGuiID hovered_id = g.HoveredIdPreviousFrame;
        ImGui::SetMouseCursor(ImGuiMouseCursor_Hand);
        if (ImGui::IsKeyPressedMap(ImGuiKey_Escape))
            g.DebugItemPickerActive = false;
        if (ImGui::IsMouseClicked(0) && hovered_id)
        {
            g.DebugItemPickerBreakId = hovered_id;
            g.DebugItemPickerActive = false;
        }
        ImGui::SetNextWindowBgAlpha(0.60f);
        ImGui::BeginTooltip();
        ImGui::Text("HoveredId: 0x%08X", hovered_id);
        ImGui::Text("Press ESC to abort picking.");
        ImGui::TextColored(GetStyleColorVec4(hovered_id ? ImGuiCol_Text : ImGuiCol_TextDisabled), "Click to break in debugger!");
        ImGui::EndTooltip();
    }
}